

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

int mbedtls_sha256_finish_ret(mbedtls_sha256_context *ctx,uchar *output)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint32_t low;
  uint32_t high;
  uint32_t used;
  int ret;
  uchar *output_local;
  mbedtls_sha256_context *ctx_local;
  
  uVar2 = ctx->total[0] & 0x3f;
  uVar5 = uVar2 + 1;
  ctx->buffer[uVar2] = 0x80;
  if (uVar5 < 0x39) {
    memset(ctx->buffer + uVar5,0,(ulong)(0x38 - uVar5));
  }
  else {
    memset(ctx->buffer + uVar5,0,(ulong)(0x40 - uVar5));
    iVar3 = mbedtls_internal_sha256_process(ctx,ctx->buffer);
    if (iVar3 != 0) {
      return iVar3;
    }
    memset(ctx->buffer,0,0x38);
  }
  uVar1 = ctx->total[0];
  iVar4 = ctx->total[1] << 3;
  iVar3 = ctx->total[0] << 3;
  ctx->buffer[0x38] = (uchar)((uint)iVar4 >> 0x18);
  ctx->buffer[0x39] = (uchar)((uint)iVar4 >> 0x10);
  ctx->buffer[0x3a] = (uchar)((uint)iVar4 >> 8);
  ctx->buffer[0x3b] = (byte)(uVar1 >> 0x1d) | (byte)iVar4;
  ctx->buffer[0x3c] = (uchar)((uint)iVar3 >> 0x18);
  ctx->buffer[0x3d] = (uchar)((uint)iVar3 >> 0x10);
  ctx->buffer[0x3e] = (uchar)((uint)iVar3 >> 8);
  ctx->buffer[0x3f] = (uchar)iVar3;
  ctx_local._4_4_ = mbedtls_internal_sha256_process(ctx,ctx->buffer);
  if (ctx_local._4_4_ == 0) {
    *output = (uchar)(ctx->state[0] >> 0x18);
    output[1] = (uchar)(ctx->state[0] >> 0x10);
    output[2] = (uchar)(ctx->state[0] >> 8);
    output[3] = (uchar)ctx->state[0];
    output[4] = (uchar)(ctx->state[1] >> 0x18);
    output[5] = (uchar)(ctx->state[1] >> 0x10);
    output[6] = (uchar)(ctx->state[1] >> 8);
    output[7] = (uchar)ctx->state[1];
    output[8] = (uchar)(ctx->state[2] >> 0x18);
    output[9] = (uchar)(ctx->state[2] >> 0x10);
    output[10] = (uchar)(ctx->state[2] >> 8);
    output[0xb] = (uchar)ctx->state[2];
    output[0xc] = (uchar)(ctx->state[3] >> 0x18);
    output[0xd] = (uchar)(ctx->state[3] >> 0x10);
    output[0xe] = (uchar)(ctx->state[3] >> 8);
    output[0xf] = (uchar)ctx->state[3];
    output[0x10] = (uchar)(ctx->state[4] >> 0x18);
    output[0x11] = (uchar)(ctx->state[4] >> 0x10);
    output[0x12] = (uchar)(ctx->state[4] >> 8);
    output[0x13] = (uchar)ctx->state[4];
    output[0x14] = (uchar)(ctx->state[5] >> 0x18);
    output[0x15] = (uchar)(ctx->state[5] >> 0x10);
    output[0x16] = (uchar)(ctx->state[5] >> 8);
    output[0x17] = (uchar)ctx->state[5];
    output[0x18] = (uchar)(ctx->state[6] >> 0x18);
    output[0x19] = (uchar)(ctx->state[6] >> 0x10);
    output[0x1a] = (uchar)(ctx->state[6] >> 8);
    output[0x1b] = (uchar)ctx->state[6];
    if (ctx->is224 == 0) {
      output[0x1c] = (uchar)(ctx->state[7] >> 0x18);
      output[0x1d] = (uchar)(ctx->state[7] >> 0x10);
      output[0x1e] = (uchar)(ctx->state[7] >> 8);
      output[0x1f] = (uchar)ctx->state[7];
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_sha256_finish_ret( mbedtls_sha256_context *ctx,
                               unsigned char output[32] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    uint32_t used;
    uint32_t high, low;

    SHA256_VALIDATE_RET( ctx != NULL );
    SHA256_VALIDATE_RET( (unsigned char *)output != NULL );

    /*
     * Add padding: 0x80 then 0x00 until 8 bytes remain for the length
     */
    used = ctx->total[0] & 0x3F;

    ctx->buffer[used++] = 0x80;

    if( used <= 56 )
    {
        /* Enough room for padding + length in current block */
        memset( ctx->buffer + used, 0, 56 - used );
    }
    else
    {
        /* We'll need an extra block */
        memset( ctx->buffer + used, 0, 64 - used );

        if( ( ret = mbedtls_internal_sha256_process( ctx, ctx->buffer ) ) != 0 )
            return( ret );

        memset( ctx->buffer, 0, 56 );
    }

    /*
     * Add message length
     */
    high = ( ctx->total[0] >> 29 )
         | ( ctx->total[1] <<  3 );
    low  = ( ctx->total[0] <<  3 );

    PUT_UINT32_BE( high, ctx->buffer, 56 );
    PUT_UINT32_BE( low,  ctx->buffer, 60 );

    if( ( ret = mbedtls_internal_sha256_process( ctx, ctx->buffer ) ) != 0 )
        return( ret );

    /*
     * Output final state
     */
    PUT_UINT32_BE( ctx->state[0], output,  0 );
    PUT_UINT32_BE( ctx->state[1], output,  4 );
    PUT_UINT32_BE( ctx->state[2], output,  8 );
    PUT_UINT32_BE( ctx->state[3], output, 12 );
    PUT_UINT32_BE( ctx->state[4], output, 16 );
    PUT_UINT32_BE( ctx->state[5], output, 20 );
    PUT_UINT32_BE( ctx->state[6], output, 24 );

    if( ctx->is224 == 0 )
        PUT_UINT32_BE( ctx->state[7], output, 28 );

    return( 0 );
}